

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_wav__write_or_count_string_to_fixed_size_buf
                 (ma_dr_wav *pWav,char *str,size_t bufFixedSize)

{
  ma_dr_wav *pWav_00;
  ma_dr_wav *in_RDX;
  char *in_RSI;
  long in_RDI;
  size_t i;
  size_t len;
  undefined7 in_stack_ffffffffffffffc8;
  ma_uint8 in_stack_ffffffffffffffcf;
  void *in_stack_ffffffffffffffd0;
  ma_dr_wav *pWav_01;
  
  if (in_RDI != 0) {
    pWav_00 = (ma_dr_wav *)ma_dr_wav__strlen_clamped(in_RSI,(size_t)in_RDX);
    ma_dr_wav__write_or_count
              (pWav_00,in_stack_ffffffffffffffd0,
               CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (pWav_00 < in_RDX) {
      for (pWav_01 = (ma_dr_wav *)0x0; pWav_01 < (ma_dr_wav *)((long)in_RDX - (long)pWav_00);
          pWav_01 = (ma_dr_wav *)((long)&pWav_01->onRead + 1)) {
        ma_dr_wav__write_byte(pWav_01,in_stack_ffffffffffffffcf);
      }
    }
  }
  return (size_t)in_RDX;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__write_or_count_string_to_fixed_size_buf(ma_dr_wav* pWav, char* str, size_t bufFixedSize)
{
    size_t len;
    if (pWav == NULL) {
        return bufFixedSize;
    }
    len = ma_dr_wav__strlen_clamped(str, bufFixedSize);
    ma_dr_wav__write_or_count(pWav, str, len);
    if (len < bufFixedSize) {
        size_t i;
        for (i = 0; i < bufFixedSize - len; ++i) {
            ma_dr_wav__write_byte(pWav, 0);
        }
    }
    return bufFixedSize;
}